

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::data_ptr::push_back(data_ptr *this,data_ptr *data)

{
  int iVar1;
  DataList *this_00;
  undefined4 extraout_var;
  element_type *peVar2;
  data_list local_38;
  
  peVar2 = (this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    this_00 = (DataList *)operator_new(0x20);
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataList::DataList(this_00,&local_38);
    std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
              (&(this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,this_00);
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector(&local_38);
    peVar2 = (this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar1 = (*peVar2->_vptr_Data[2])();
  std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
            ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
             CONCAT44(extraout_var,iVar1),data);
  return;
}

Assistant:

inline void data_ptr::push_back(const data_ptr& data) {
        if (!ptr) {
            ptr.reset(new DataList(data_list()));
        }
        data_list& list = ptr->getlist();
        list.push_back(data);
    }